

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderContext.cpp
# Opt level: O2

RenderContext *
glu::createDefaultRenderContext(Platform *platform,CommandLine *cmdLine,ApiType apiType)

{
  bool bVar1;
  char *pcVar2;
  RenderContext *pRVar3;
  NotSupportedError *this;
  long lVar4;
  uint uVar5;
  pointer __rhs;
  long lVar6;
  allocator<char> local_10a;
  allocator<char> local_109;
  Platform *local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagNames;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  RenderConfig local_68;
  
  local_68.width = -1;
  local_68.height = -1;
  local_68.surfaceType = SURFACETYPE_DONT_CARE;
  local_68.windowVisibility = VISIBILITY_VISIBLE;
  local_68.id = -1;
  local_68.redBits = -1;
  local_68.greenBits = -1;
  local_68.blueBits = -1;
  local_68.alphaBits = -1;
  local_68.depthBits = -1;
  local_68.stencilBits = -1;
  local_68.numSamples = -1;
  local_68.resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  pcVar2 = tcu::CommandLine::getGLContextFlags(cmdLine);
  if (pcVar2 == (char *)0x0) {
    uVar5 = 0;
  }
  else {
    local_108 = platform;
    pcVar2 = tcu::CommandLine::getGLContextFlags(cmdLine);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar2,&local_10a);
    de::splitString(&flagNames,&local_e8,',');
    uVar5 = 0;
    for (__rhs = flagNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __rhs != flagNames.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish; __rhs = __rhs + 1) {
      lVar6 = 0;
      do {
        lVar4 = lVar6;
        if (lVar4 + 0x10 == 0x30) {
          tcu::print("ERROR: Unrecognized GL context flag \'%s\'\n",(__rhs->_M_dataplus)._M_p);
          tcu::print("Supported GL context flags:\n");
          for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 0x10) {
            tcu::print("  %s\n",*(undefined8 *)
                                 ((long)&parseContextFlags(std::__cxx11::string_const&)::s_flagMap +
                                 lVar6));
          }
          this = (NotSupportedError *)__cxa_allocate_exception(0x38);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"Unknown GL context flag \'",&local_109);
          std::operator+(&local_a8,&local_c8,__rhs);
          std::operator+(&local_88,&local_a8,"\'");
          tcu::NotSupportedError::NotSupportedError
                    (this,local_88._M_dataplus._M_p,(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluRenderContext.cpp"
                     ,0x7f);
          __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
        }
        bVar1 = std::operator==(__rhs,*(char **)((long)&
                                                  parseContextFlags(std::__cxx11::string_const&)::
                                                  s_flagMap + lVar4));
        lVar6 = lVar4 + 0x10;
      } while (!bVar1);
      uVar5 = uVar5 | *(uint *)((long)&DAT_00281798 + lVar4);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&flagNames);
    std::__cxx11::string::~string((string *)&local_e8);
    uVar5 = uVar5 << 10;
    platform = local_108;
  }
  local_68.type.super_ApiType.m_bits = (ApiType)(uVar5 | apiType.m_bits);
  parseRenderConfig(&local_68,cmdLine);
  pRVar3 = createRenderContext(platform,cmdLine,&local_68);
  return pRVar3;
}

Assistant:

RenderContext* createDefaultRenderContext (tcu::Platform& platform, const tcu::CommandLine& cmdLine, ApiType apiType)
{
	RenderConfig	config;
	ContextFlags	ctxFlags	= ContextFlags(0);

	if (cmdLine.getGLContextFlags())
		ctxFlags = parseContextFlags(cmdLine.getGLContextFlags());

	config.type = glu::ContextType(apiType, ctxFlags);
	parseRenderConfig(&config, cmdLine);

	return createRenderContext(platform, cmdLine, config);
}